

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

RESOURCE_STATE Diligent::VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)

{
  Uint32 BitPos;
  RESOURCE_STATE RVar1;
  int iVar2;
  RESOURCE_STATE RVar3;
  
  if (VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState == '\0') {
    iVar2 = __cxa_guard_acquire(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState);
    if (iVar2 != 0) {
      VkAccessFlagBitPosToResourceState::VkAccessFlagBitPosToResourceState
                (&VkAccessFlagsToResourceStates::BitPosToState);
      __cxa_guard_release(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState);
    }
  }
  RVar3 = RESOURCE_STATE_UNKNOWN;
  for (; AccessFlags != 0; AccessFlags = AccessFlags & ~(1 << (BitPos & 0x1f))) {
    BitPos = 0;
    if (AccessFlags != 0) {
      for (; (AccessFlags >> BitPos & 1) == 0; BitPos = BitPos + 1) {
      }
    }
    RVar1 = VkAccessFlagBitPosToResourceState::operator()
                      (&VkAccessFlagsToResourceStates::BitPosToState,BitPos);
    RVar3 = RVar3 | RVar1;
  }
  return RVar3;
}

Assistant:

RESOURCE_STATE VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)
{
    static const VkAccessFlagBitPosToResourceState BitPosToState;
    Uint32                                         State = 0;
    while (AccessFlags != 0)
    {
        Uint32 lsb = PlatformMisc::GetLSB(AccessFlags);
        State |= BitPosToState(lsb);
        AccessFlags &= ~(1 << lsb);
    }
    return static_cast<RESOURCE_STATE>(State);
}